

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AutoReg::AutoReg
          (AutoReg *this,ITestInvoker *invoker,SourceLineInfo *lineInfo,StringRef *classOrMethod,
          NameAndTags *nameAndTags)

{
  SourceLineInfo *_testCase;
  IMutableRegistryHub *pIVar1;
  StringRef *classOrQualifiedMethodName;
  string local_118;
  TestCase local_f8;
  NameAndTags *local_30;
  NameAndTags *nameAndTags_local;
  StringRef *classOrMethod_local;
  SourceLineInfo *lineInfo_local;
  ITestInvoker *invoker_local;
  AutoReg *this_local;
  
  local_30 = nameAndTags;
  nameAndTags_local = (NameAndTags *)classOrMethod;
  classOrMethod_local = (StringRef *)lineInfo;
  lineInfo_local = (SourceLineInfo *)invoker;
  invoker_local = (ITestInvoker *)this;
  NonCopyable::NonCopyable(&this->super_NonCopyable);
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__AutoReg_004045e0;
  pIVar1 = getMutableRegistryHub();
  _testCase = lineInfo_local;
  extractClassName_abi_cxx11_(&local_118,(Catch *)nameAndTags_local,classOrQualifiedMethodName);
  makeTestCase(&local_f8,(ITestInvoker *)_testCase,&local_118,local_30,
               (SourceLineInfo *)classOrMethod_local);
  (*pIVar1->_vptr_IMutableRegistryHub[4])(pIVar1,&local_f8);
  TestCase::~TestCase(&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  return;
}

Assistant:

AutoReg::AutoReg( ITestInvoker* invoker, SourceLineInfo const& lineInfo, StringRef const& classOrMethod, NameAndTags const& nameAndTags ) noexcept {
        CATCH_TRY {
            getMutableRegistryHub()
                    .registerTest(
                        makeTestCase(
                            invoker,
                            extractClassName( classOrMethod ),
                            nameAndTags,
                            lineInfo));
        }